

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_code_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::MockCodeGenerator::GetOutputFileContent_abi_cxx11_
          (string *__return_storage_ptr__,MockCodeGenerator *this,string_view generator_name,
          string_view parameter,FileDescriptor *file,GeneratorContext *context)

{
  string_view file_00;
  string_view parsed_file_list;
  string_view first_message_name;
  size_t sVar1;
  string *__return_storage_ptr___00;
  char *pcVar2;
  char *pcVar3;
  string_view generator_name_00;
  string_view parameter_00;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  all_files;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  names;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_c8;
  size_t local_a8;
  string *local_a0;
  MockCodeGenerator *local_98;
  long *local_80;
  size_t local_78;
  long local_70 [2];
  size_t local_60;
  char *pcStack_58;
  size_t local_50;
  long *plStack_48;
  size_t local_40;
  char *pcStack_38;
  
  pcVar2 = parameter._M_str;
  parameter_00._M_len = parameter._M_len;
  generator_name_00._M_str = generator_name._M_str;
  pcVar3 = pcVar2;
  local_98 = this;
  (**(code **)(*(long *)file + 0x30))();
  pcStack_38 = (char *)**(undefined8 **)(pcVar2 + 8);
  local_40 = (*(undefined8 **)(pcVar2 + 8))[1];
  local_c8.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8 = generator_name._M_len;
  local_a0 = __return_storage_ptr__;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::reserve(&local_c8,0);
  absl::lts_20250127::strings_internal::
  JoinAlgorithm<__gnu_cxx::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>const*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>,void>
            (&local_80,
             (strings_internal *)
             local_c8.
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_c8.
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,1,",");
  __return_storage_ptr___00 = local_a0;
  sVar1 = local_a8;
  if (local_c8.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_50 = local_78;
  plStack_48 = local_80;
  if (*(int *)(pcVar2 + 0x3c) < 1) {
    pcStack_58 = "(none)";
    local_60 = 6;
  }
  else {
    local_60 = (size_t)**(ushort **)(*(long *)(pcVar2 + 0x60) + 0x10);
    pcStack_58 = (char *)(~local_60 + (long)*(ushort **)(*(long *)(pcVar2 + 0x60) + 0x10));
  }
  file_00._M_str = pcStack_38;
  file_00._M_len = local_40;
  parsed_file_list._M_str = (char *)local_80;
  parsed_file_list._M_len = local_78;
  first_message_name._M_str = pcStack_58;
  first_message_name._M_len = local_60;
  generator_name_00._M_len = sVar1;
  parameter_00._M_str = pcVar3;
  GetOutputFileContent_abi_cxx11_
            (__return_storage_ptr___00,local_98,generator_name_00,parameter_00,file_00,
             parsed_file_list,first_message_name);
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  return __return_storage_ptr___00;
}

Assistant:

std::string MockCodeGenerator::GetOutputFileContent(
    absl::string_view generator_name, absl::string_view parameter,
    const FileDescriptor* file, GeneratorContext* context) {
  std::vector<const FileDescriptor*> all_files;
  context->ListParsedFiles(&all_files);
  return GetOutputFileContent(
      generator_name, parameter, file->name(), CommaSeparatedList(all_files),
      file->message_type_count() > 0 ? file->message_type(0)->name()
                                     : "(none)");
}